

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void __thiscall
Bitmap_Operation::BitmapFileHeader::set
          (BitmapFileHeader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t offset;
  size_t *in_stack_ffffffffffffffd8;
  
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x12ff60);
  get_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x12ff78);
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x12ff90);
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x12ffa8);
  get_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x12ffc0);
  return;
}

Assistant:

void set( const std::vector < uint8_t > & data )
        {
            size_t offset = 0;
            get_value( data, offset, bfType );
            get_value( data, offset, bfSize );
            get_value( data, offset, bfReserved1 );
            get_value( data, offset, bfReserved2 );
            get_value( data, offset, bfOffBits );
        }